

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O1

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  AlignmentSubtype AVar6;
  int iVar7;
  AlignmentType AVar8;
  pointer ppNVar9;
  long lVar10;
  __mxxxi *palVar11;
  Implementation *pIVar12;
  Node *pNVar13;
  pointer ppEVar14;
  undefined4 *puVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  char cVar20;
  int *piVar22;
  int iVar23;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  long lVar28;
  pointer ppEVar29;
  byte bVar30;
  uint uVar31;
  int iVar32;
  const_iterator __end5;
  ulong uVar33;
  const_iterator __end4;
  bool bVar34;
  __mxxxi alVar35;
  undefined1 auVar36 [32];
  type unpacked [16];
  ulong local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  short sVar21;
  
  bVar3 = (this->super_AlignmentEngine).m_;
  bVar30 = (this->super_AlignmentEngine).n_;
  bVar25 = (char)bVar3 >> 7;
  bVar25 = (bVar3 ^ bVar25) - bVar25;
  bVar26 = (char)bVar30 >> 7;
  bVar26 = (bVar30 ^ bVar26) - bVar26;
  bVar3 = (this->super_AlignmentEngine).g_;
  bVar27 = (char)bVar3 >> 7;
  bVar27 = (bVar3 ^ bVar27) - bVar27;
  bVar3 = (this->super_AlignmentEngine).q_;
  bVar30 = (char)bVar3 >> 7;
  bVar30 = (bVar3 ^ bVar30) - bVar30;
  if (bVar26 < bVar25) {
    bVar26 = bVar25;
  }
  if (bVar30 < bVar27) {
    bVar30 = bVar27;
  }
  if (bVar30 < bVar26) {
    bVar30 = bVar26;
  }
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  if (graph->num_codes_ != 0) {
    local_88 = 0;
    do {
      if (matrix_width != 0) {
        iVar23 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_88 & 0xff];
        uVar31 = 0;
        uVar24 = 0;
        do {
          uVar33 = (ulong)uVar31;
          cVar4 = (this->super_AlignmentEngine).m_;
          cVar5 = (this->super_AlignmentEngine).n_;
          lVar28 = 0;
          do {
            sVar21 = -(ushort)bVar30;
            if (uVar33 < normal_matrix_width) {
              cVar20 = cVar4;
              if (sequence[uVar33] != (char)iVar23) {
                cVar20 = cVar5;
              }
              sVar21 = (short)cVar20;
            }
            *(short *)((long)&local_80 + lVar28) = sVar21;
            lVar28 = lVar28 + 2;
            uVar33 = uVar33 + 1;
          } while (lVar28 != 0x20);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->sequence_profile + local_88 * matrix_width + uVar24;
          (*palVar11)[0] = local_80;
          (*palVar11)[1] = lStack_78;
          (*palVar11)[2] = lStack_70;
          (*palVar11)[3] = lStack_68;
          uVar24 = (ulong)((int)uVar24 + 1);
          uVar31 = uVar31 + 0x10;
        } while (uVar24 < matrix_width);
      }
      local_88 = local_88 + 1;
    } while (local_88 < graph->num_codes_);
  }
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar28 = (long)(graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar9;
  if (lVar28 != 0) {
    lVar10 = *(long *)&(((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         .
                         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl)->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    uVar24 = 0;
    do {
      *(int *)(lVar10 + (ulong)ppNVar9[uVar24]->id * 4) = (int)uVar24;
      uVar24 = uVar24 + 1;
    } while ((uVar24 & 0xffffffff) < (ulong)(lVar28 >> 3));
  }
  AVar6 = (this->super_AlignmentEngine).subtype_;
  if (AVar6 != kAffine) {
    if (AVar6 != kConvex) goto LAB_00110d18;
    if (matrix_width != 0) {
      uVar24 = 0;
      do {
        palVar11 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->O + uVar24;
        (*palVar11)[0] = -0x7bff7bff7bff7c00;
        (*palVar11)[1] = -0x7bff7bff7bff7c00;
        (*palVar11)[2] = -0x7bff7bff7bff7c00;
        (*palVar11)[3] = -0x7bff7bff7bff7c00;
        alVar35 = (__mxxxi)vpbroadcastw_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->Q[uVar24] = alVar35;
        auVar36 = vpbroadcastw_avx512vl();
        iVar23 = 0xf;
        do {
          auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
          auVar36 = vpalignr_avx2(auVar36,auVar16,0xe);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->Q;
          alVar35 = (__mxxxi)vpaddw_avx2(auVar36,(undefined1  [32])palVar11[uVar24]);
          palVar11[uVar24] = alVar35;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        uVar24 = uVar24 + 1;
      } while ((uVar24 & 0xffffffff) < matrix_width);
    }
    pIVar12 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    lVar28 = *(long *)&(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl
    ;
    *(undefined4 *)(lVar28 + matrix_height * 8) = 0;
    if (1 < matrix_height) {
      ppNVar9 = (graph->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar28 = lVar28 + matrix_height * 8;
      uVar24 = 1;
      do {
        pNVar13 = ppNVar9[(int)uVar24 - 1];
        ppEVar29 = (pNVar13->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar14 = *(pointer *)
                    ((long)&(pNVar13->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar32 = (int)(this->super_AlignmentEngine).c_;
        iVar23 = (this->super_AlignmentEngine).q_ - iVar32;
        if (ppEVar29 != ppEVar14) {
          iVar23 = -0x7c00;
          do {
            iVar7 = *(int *)(lVar28 + (ulong)(*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar29)->tail->id * 4) + 1) * 4);
            if (iVar7 < iVar23) {
              iVar7 = iVar23;
            }
            iVar23 = iVar7;
            ppEVar29 = ppEVar29 + 1;
          } while (ppEVar29 != ppEVar14);
        }
        *(int *)(lVar28 + uVar24 * 4) = iVar23 + iVar32;
        uVar24 = (ulong)((int)uVar24 + 1);
      } while (uVar24 < matrix_height);
    }
  }
  if (matrix_width != 0) {
    uVar24 = 0;
    do {
      palVar11 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->F + uVar24;
      (*palVar11)[0] = -0x7bff7bff7bff7c00;
      (*palVar11)[1] = -0x7bff7bff7bff7c00;
      (*palVar11)[2] = -0x7bff7bff7bff7c00;
      (*palVar11)[3] = -0x7bff7bff7bff7c00;
      alVar35 = (__mxxxi)vpbroadcastw_avx512vl();
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       .
       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
      ._M_head_impl)->E[uVar24] = alVar35;
      auVar36 = vpbroadcastw_avx512vl();
      iVar23 = 0xf;
      do {
        auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
        auVar36 = vpalignr_avx2(auVar36,auVar16,0xe);
        palVar11 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->E;
        alVar35 = (__mxxxi)vpaddw_avx2(auVar36,(undefined1  [32])palVar11[uVar24]);
        palVar11[uVar24] = alVar35;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
      uVar24 = uVar24 + 1;
    } while ((uVar24 & 0xffffffff) < matrix_width);
  }
  pIVar12 = (this->pimpl_)._M_t.
            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            .
            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
            ._M_head_impl;
  lVar28 = *(long *)&(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  *(undefined4 *)(lVar28 + matrix_height * 4) = 0;
  if (1 < matrix_height) {
    lVar28 = lVar28 + matrix_height * 4;
    ppNVar9 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar24 = 1;
    do {
      pNVar13 = ppNVar9[(int)uVar24 - 1];
      ppEVar29 = (pNVar13->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar14 = *(pointer *)
                  ((long)&(pNVar13->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      iVar32 = (int)(this->super_AlignmentEngine).e_;
      iVar23 = (this->super_AlignmentEngine).g_ - iVar32;
      if (ppEVar29 != ppEVar14) {
        iVar23 = -0x7c00;
        do {
          iVar7 = *(int *)(lVar28 + (ulong)(*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar29)->tail->id * 4) + 1) * 4);
          if (iVar7 < iVar23) {
            iVar7 = iVar23;
          }
          iVar23 = iVar7;
          ppEVar29 = ppEVar29 + 1;
        } while (ppEVar29 != ppEVar14);
      }
      *(int *)(lVar28 + uVar24 * 4) = iVar23 + iVar32;
      uVar24 = (ulong)((int)uVar24 + 1);
    } while (uVar24 < matrix_height);
  }
LAB_00110d18:
  AVar8 = (this->super_AlignmentEngine).type_;
  if (AVar8 == kOV) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kConvex) {
      if (matrix_width != 0) {
        uVar31 = 1;
        lVar28 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          auVar36 = vpmaxsw_avx2(*(undefined1 (*) [32])((long)*pIVar12->E + lVar28),
                                 *(undefined1 (*) [32])((long)*pIVar12->Q + lVar28));
          *(undefined1 (*) [32])((long)*pIVar12->H + lVar28) = auVar36;
          uVar24 = (ulong)uVar31;
          lVar28 = lVar28 + 0x20;
          uVar31 = uVar31 + 1;
        } while (uVar24 < matrix_width);
      }
    }
    else if (AVar6 == kAffine) {
      if (matrix_width != 0) {
        uVar31 = 1;
        lVar28 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          puVar1 = (undefined8 *)((long)*pIVar12->E + lVar28);
          uVar17 = puVar1[1];
          uVar18 = puVar1[2];
          uVar19 = puVar1[3];
          puVar2 = (undefined8 *)((long)*pIVar12->H + lVar28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          uVar24 = (ulong)uVar31;
          lVar28 = lVar28 + 0x20;
          uVar31 = uVar31 + 1;
        } while (uVar24 < matrix_width);
      }
    }
    else if ((AVar6 == kLinear) && (matrix_width != 0)) {
      uVar24 = 0;
      do {
        alVar35 = (__mxxxi)vpbroadcastw_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar24] = alVar35;
        auVar36 = vpbroadcastw_avx512vl();
        iVar23 = 0xf;
        do {
          auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
          auVar36 = vpalignr_avx2(auVar36,auVar16,0xe);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar35 = (__mxxxi)vpaddw_avx2(auVar36,(undefined1  [32])palVar11[uVar24]);
          palVar11[uVar24] = alVar35;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        uVar24 = uVar24 + 1;
      } while ((uVar24 & 0xffffffff) < matrix_width);
    }
    if (matrix_height != 0) {
      lVar28 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar24 = 0;
      do {
        *(undefined4 *)(lVar28 + uVar24 * 4) = 0;
        uVar24 = uVar24 + 1;
      } while ((uVar24 & 0xffffffff) < matrix_height);
    }
  }
  else if (AVar8 == kNW) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kLinear) {
      pIVar12 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      puVar15 = *(undefined4 **)
                 &(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      *puVar15 = 0;
      if (1 < matrix_height) {
        ppNVar9 = (graph->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        cVar4 = (this->super_AlignmentEngine).g_;
        uVar24 = 1;
        do {
          pNVar13 = ppNVar9[(int)uVar24 - 1];
          ppEVar29 = (pNVar13->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar14 = *(pointer *)
                      ((long)&(pNVar13->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          iVar23 = -0x7c00;
          if (ppEVar29 == ppEVar14) {
            iVar23 = 0;
          }
          else {
            do {
              iVar32 = puVar15[*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar29)->tail->id * 4) + 1];
              if ((int)puVar15[*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar29)->tail->id * 4) + 1] < iVar23) {
                iVar32 = iVar23;
              }
              iVar23 = iVar32;
              ppEVar29 = ppEVar29 + 1;
            } while (ppEVar29 != ppEVar14);
          }
          puVar15[uVar24] = iVar23 + cVar4;
          uVar24 = (ulong)((int)uVar24 + 1);
        } while (uVar24 < matrix_height);
      }
      if (matrix_width != 0) {
        uVar24 = 0;
        do {
          alVar35 = (__mxxxi)vpbroadcastw_avx512vl();
          ((this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
          ._M_head_impl)->H[uVar24] = alVar35;
          auVar36 = vpbroadcastw_avx512vl();
          iVar23 = 0xf;
          do {
            auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
            auVar36 = vpalignr_avx2(auVar36,auVar16,0xe);
            palVar11 = ((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                       ._M_head_impl)->H;
            alVar35 = (__mxxxi)vpaddw_avx2(auVar36,(undefined1  [32])palVar11[uVar24]);
            palVar11[uVar24] = alVar35;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
          uVar24 = uVar24 + 1;
        } while ((uVar24 & 0xffffffff) < matrix_width);
      }
    }
    else if (AVar6 == kConvex) {
      if (matrix_height != 0) {
        piVar22 = *(int **)&(((this->pimpl_)._M_t.
                              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              .
                              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                             ._M_head_impl)->first_column).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar24 = 1;
        do {
          iVar23 = piVar22[matrix_height * 2];
          if (piVar22[matrix_height * 2] < piVar22[matrix_height]) {
            iVar23 = piVar22[matrix_height];
          }
          *piVar22 = iVar23;
          piVar22 = piVar22 + 1;
          bVar34 = uVar24 < matrix_height;
          uVar24 = (ulong)((int)uVar24 + 1);
        } while (bVar34);
      }
      if (matrix_width != 0) {
        uVar31 = 1;
        lVar28 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          auVar36 = vpmaxsw_avx2(*(undefined1 (*) [32])((long)*pIVar12->E + lVar28),
                                 *(undefined1 (*) [32])((long)*pIVar12->Q + lVar28));
          *(undefined1 (*) [32])((long)*pIVar12->H + lVar28) = auVar36;
          uVar24 = (ulong)uVar31;
          lVar28 = lVar28 + 0x20;
          uVar31 = uVar31 + 1;
        } while (uVar24 < matrix_width);
      }
    }
    else if (AVar6 == kAffine) {
      if (matrix_height != 0) {
        lVar28 = *(long *)&(((this->pimpl_)._M_t.
                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             .
                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                            ._M_head_impl)->first_column).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar24 = 0;
        do {
          *(undefined4 *)(lVar28 + uVar24 * 4) =
               *(undefined4 *)(lVar28 + matrix_height * 4 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while ((uVar24 & 0xffffffff) < matrix_height);
      }
      if (matrix_width != 0) {
        uVar31 = 1;
        lVar28 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          puVar1 = (undefined8 *)((long)*pIVar12->E + lVar28);
          uVar17 = puVar1[1];
          uVar18 = puVar1[2];
          uVar19 = puVar1[3];
          puVar2 = (undefined8 *)((long)*pIVar12->H + lVar28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          uVar24 = (ulong)uVar31;
          lVar28 = lVar28 + 0x20;
          uVar31 = uVar31 + 1;
        } while (uVar24 < matrix_width);
      }
    }
  }
  else if (AVar8 == kSW) {
    if (matrix_width != 0) {
      uVar31 = 1;
      lVar28 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)*((this->pimpl_)._M_t.
                          super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          .
                          super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                         ._M_head_impl)->H + lVar28);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        uVar24 = (ulong)uVar31;
        lVar28 = lVar28 + 0x20;
        uVar31 = uVar31 + 1;
      } while (uVar24 < matrix_width);
    }
    if (matrix_height != 0) {
      lVar28 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar24 = 0;
      do {
        *(undefined4 *)(lVar28 + uVar24 * 4) = 0;
        uVar24 = uVar24 + 1;
      } while ((uVar24 & 0xffffffff) < matrix_height);
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}